

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

SliceBySizeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_slicebysize(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x5be) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x5be;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x28);
    SliceBySizeLayerParams::SliceBySizeLayerParams(this_00.slicebysize_);
    (this->layer_).slicebysize_ = (SliceBySizeLayerParams *)this_00;
  }
  return (SliceBySizeLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::SliceBySizeLayerParams* NeuralNetworkLayer::mutable_slicebysize() {
  if (!has_slicebysize()) {
    clear_layer();
    set_has_slicebysize();
    layer_.slicebysize_ = new ::CoreML::Specification::SliceBySizeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.sliceBySize)
  return layer_.slicebysize_;
}